

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::BrLong(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined4 local_2c;
  undefined8 uStack_28;
  OpLayoutBrLong data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  ByteCodeLabel local_18;
  OpCode local_12;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_18 = labelID;
  local_12 = op;
  _labelID_local = this;
  if ((this->useBranchIsland & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xaec,"(useBranchIsland)","useBranchIsland");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckOpen(this);
  op_00 = local_12;
  OpLayoutType::OpLayoutType((OpLayoutType *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),BrLong);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._4_4_);
  CheckLabel(this,local_18);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_12);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xaf0,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uStack_28 = 4;
  local_2c = 4;
  Data::Encode(&this->m_byteCodeData,local_12,&local_2c,4,this);
  AddLongJumpOffset(this,local_18,4);
  return;
}

Assistant:

void ByteCodeWriter::BrLong(OpCode op, ByteCodeLabel labelID)
    {
        Assert(useBranchIsland);
        CheckOpen();
        CheckOp(op, OpLayoutType::BrLong);
        CheckLabel(labelID);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrLong) - offsetof(OpLayoutBrLong, RelativeJumpOffset);
        OpLayoutBrLong data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddLongJumpOffset(labelID, offsetOfRelativeJumpOffsetFromEnd);
    }